

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O3

void deqp::gles3::Functional::evalTextureCubeShadowGrad
               (ShaderEvalContext *c,TexLookupParams *param_2)

{
  float s;
  float t;
  float r;
  float fVar1;
  float fVar2;
  
  fVar1 = c->in[0].m_data[3];
  s = c->in[0].m_data[0];
  t = c->in[0].m_data[1];
  r = c->in[0].m_data[2];
  fVar2 = -r;
  if (-r <= r) {
    fVar2 = r;
  }
  fVar2 = (float)(c->textures[0].texCube)->m_size / (fVar2 + fVar2);
  fVar2 = glu::TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,c->in[1].m_data[0] * fVar2,c->in[1].m_data[1] * fVar2,
                     c->in[2].m_data[0] * fVar2,fVar2 * c->in[2].m_data[1]);
  fVar1 = tcu::TextureCubeView::sampleCompare
                    (&(c->textures[0].texCube)->m_view,&c->textures[0].sampler,fVar1,s,t,r,fVar2);
  (c->color).m_data[0] = fVar1;
  return;
}

Assistant:

static void		evalTextureCubeShadowGrad		(gls::ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = textureCubeShadow(c, c.in[0].w(), c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGradCube(c)); }